

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::lts_20250127::
InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
::pop_back(InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
           *this)

{
  bool bVar1;
  allocator<absl::lts_20250127::cord_internal::CordRep_*> *__a;
  pointer ppCVar2;
  size_type sVar3;
  anon_class_1_0_00000001 local_11;
  InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  *local_10;
  InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  *this_local;
  
  local_10 = this;
  bVar1 = empty(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pop_back::anon_class_1_0_00000001::operator()(&local_11);
  }
  __a = inlined_vector_internal::
        Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
        ::GetAllocator(&this->storage_);
  ppCVar2 = data(this);
  sVar3 = size(this);
  std::allocator_traits<std::allocator<absl::lts_20250127::cord_internal::CordRep*>>::
  destroy<absl::lts_20250127::cord_internal::CordRep*>(__a,ppCVar2 + (sVar3 - 1));
  inlined_vector_internal::
  Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  ::SubtractSize(&this->storage_,1);
  return;
}

Assistant:

void pop_back() noexcept {
    ABSL_HARDENING_ASSERT(!empty());

    AllocatorTraits<A>::destroy(storage_.GetAllocator(), data() + (size() - 1));
    storage_.SubtractSize(1);
  }